

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_copy_props(Tree *this,size_t dst_,Tree *that_tree,size_t src_)

{
  NodeData *pNVar1;
  NodeData *pNVar2;
  NodeData *src;
  NodeData *dst;
  
  pNVar1 = _p(that_tree,src_);
  pNVar2 = _p(that_tree,src_);
  (pNVar1->m_type).type = (pNVar2->m_type).type;
  memcpy(&pNVar1->m_key,&pNVar2->m_key,0x30);
  memcpy(&pNVar1->m_val,&pNVar2->m_val,0x30);
  return;
}

Assistant:

void _copy_props(size_t dst_, Tree const* that_tree, size_t src_)
    {
        auto      & C4_RESTRICT dst = *_p(dst_);
        auto const& C4_RESTRICT src = *that_tree->_p(src_);
        dst.m_type = src.m_type;
        dst.m_key  = src.m_key;
        dst.m_val  = src.m_val;
    }